

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

bool __thiscall
flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
          (Table *this,Verifier *verifier,voffset_t field)

{
  bool bVar1;
  voffset_t start;
  size_t sVar2;
  undefined1 local_1d;
  voffset_t field_offset;
  voffset_t field_local;
  Verifier *verifier_local;
  Table *this_local;
  
  start = GetOptionalFieldOffset(this,field);
  bVar1 = VerifierTemplate<false>::Check(verifier,start != 0);
  local_1d = false;
  if (bVar1) {
    sVar2 = VerifierTemplate<false>::VerifyOffset<unsigned_int>(verifier,(uint8_t *)this,start);
    local_1d = sVar2 != 0;
  }
  return local_1d;
}

Assistant:

bool VerifyOffsetRequired(const Verifier &verifier, voffset_t field) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return verifier.Check(field_offset != 0) &&
           verifier.VerifyOffset<OffsetT>(data_, field_offset);
  }